

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O3

void __thiscall
stackjit::AssemblyImageGenerator::generateImage
          (AssemblyImageGenerator *this,
          vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
          *assemblies,ostream *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Assembly *pAVar2;
  pointer pFVar3;
  pointer pCVar4;
  pointer pcVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_> *pvVar9;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *pvVar10;
  string *psVar11;
  iterator iVar12;
  size_t i;
  long lVar13;
  Function *function;
  Function *extraout_RDX;
  Function *function_00;
  Function *extraout_RDX_00;
  unsigned_long value;
  pointer pFVar14;
  _Alloc_hider this_00;
  pointer pFVar15;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  pointer pCVar16;
  unsigned_long value_00;
  Assembly *assembly;
  Assembly *this_02;
  BinaryData data;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  classBodyOffsets;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  funcBodyOffsets;
  undefined1 local_108 [48];
  string local_d8;
  long local_b8;
  ostream *local_b0;
  undefined1 local_a8 [24];
  size_type sStack_90;
  long local_88;
  size_t local_80;
  __node_base_ptr p_Stack_78;
  long local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  this_02 = *(Assembly **)assemblies;
  pAVar2 = *(Assembly **)(assemblies + 8);
  local_108._40_8_ = assemblies;
  local_b0 = stream;
  if (this_02 == pAVar2) {
    value = 0;
    value_00 = 0;
  }
  else {
    value_00 = 0;
    value = 0;
    do {
      pvVar9 = Loader::Assembly::functions(this_02);
      pFVar14 = (pvVar9->
                super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pFVar15 = (pvVar9->
                super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      pvVar10 = Loader::Assembly::classes(this_02);
      value_00 = value_00 + ((long)pFVar15 - (long)pFVar14 >> 4) * -0xf0f0f0f0f0f0f0f;
      value = value + ((long)(pvVar10->
                             super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar10->
                             super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
      this_02 = this_02 + 1;
    } while (this_02 != pAVar2);
  }
  anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,value_00);
  anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,value);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pFVar14 = (pointer)(((string *)local_108._40_8_)->_M_dataplus)._M_p;
  local_108._24_8_ = ((string *)local_108._40_8_)->_M_string_length;
  pFVar15 = pFVar14;
  if (pFVar14 != (pointer)local_108._24_8_) {
    paVar1 = &local_d8.field_2;
    do {
      local_108._32_8_ = pFVar14;
      pvVar9 = Loader::Assembly::functions((Assembly *)pFVar14);
      pFVar3 = (pvVar9->
               super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pFVar15 = (pvVar9->
                     super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                     )._M_impl.super__Vector_impl_data._M_start; pFVar15 != pFVar3;
          pFVar15 = pFVar15 + 1) {
        generateFunctionDefinition
                  ((AssemblyImageGenerator *)pFVar14,(BinaryData *)local_108,pFVar15);
        Loader::getSignature_abi_cxx11_(&local_d8,(Loader *)pFVar15,function);
        local_88 = local_108._8_8_ - local_108._0_8_;
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_a8 + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          local_a8._0_8_ = local_d8._M_dataplus._M_p;
        }
        local_a8._20_4_ = local_d8.field_2._M_allocated_capacity._4_4_;
        local_a8._16_4_ = local_d8.field_2._M_allocated_capacity._0_4_;
        local_a8._8_8_ = local_d8._M_string_length;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_allocated_capacity._0_4_ =
             local_d8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_d8._M_dataplus._M_p = (pointer)paVar1;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        pFVar14 = (pointer)local_108;
        anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,0);
      }
      pFVar14 = (pointer)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_108._32_8_ + 0x40))->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage;
    } while (pFVar14 != (pointer)local_108._24_8_);
    pFVar14 = (pointer)(((string *)local_108._40_8_)->_M_dataplus)._M_p;
    pFVar15 = (pointer)((string *)local_108._40_8_)->_M_string_length;
  }
  local_a8._0_8_ = &p_Stack_78;
  local_a8._8_8_ = 1;
  local_a8._16_8_ = (_Hash_node_base *)0x0;
  sStack_90 = 0;
  local_88 = CONCAT44(local_88._4_4_,1.0);
  local_80 = 0;
  p_Stack_78 = (__node_base_ptr)0x0;
  if (pFVar14 != pFVar15) {
    local_108._32_8_ = pFVar15;
    do {
      local_108._24_8_ = pFVar14;
      pvVar10 = Loader::Assembly::classes((Assembly *)pFVar14);
      pCVar4 = (pvVar10->
               super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar16 = (pvVar10->
                     super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                     )._M_impl.super__Vector_impl_data._M_start; pCVar16 != pCVar4;
          pCVar16 = pCVar16 + 1) {
        psVar11 = Loader::Class::name_abi_cxx11_(pCVar16);
        anon_unknown_3::addString((BinaryData *)local_108,psVar11);
        psVar11 = Loader::Class::name_abi_cxx11_(pCVar16);
        uVar8 = local_108._8_8_;
        uVar7 = local_108._0_8_;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        pcVar5 = (psVar11->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar5,pcVar5 + psVar11->_M_string_length);
        local_b8 = uVar8 - uVar7;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,0);
      }
      pFVar14 = (pointer)(local_108._24_8_ + 0x50);
    } while (pFVar14 != (pointer)local_108._32_8_);
    pFVar14 = (pointer)(((string *)local_108._40_8_)->_M_dataplus)._M_p;
    pFVar15 = (pointer)((string *)local_108._40_8_)->_M_string_length;
  }
  if (pFVar14 != pFVar15) {
    local_108._32_8_ = pFVar15;
    do {
      local_108._24_8_ = pFVar14;
      pvVar9 = Loader::Assembly::functions((Assembly *)pFVar14);
      pFVar15 = (pvVar9->
                super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      function_00 = extraout_RDX;
      for (pFVar14 = (pvVar9->
                     super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                     )._M_impl.super__Vector_impl_data._M_start; pFVar14 != pFVar15;
          pFVar14 = pFVar14 + 1) {
        Loader::getSignature_abi_cxx11_(&local_d8,(Loader *)pFVar14,function_00);
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_68,&local_d8);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        lVar6 = *(long *)((long)iVar12.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                ._M_cur + 0x28);
        local_70 = local_108._8_8_ - local_108._0_8_;
        lVar13 = 0;
        do {
          *(char *)(local_108._0_8_ + lVar13 + lVar6) = *(char *)((long)&local_70 + lVar13);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 8);
        this_00._M_p = local_d8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        generateFunctionBody((AssemblyImageGenerator *)this_00._M_p,(BinaryData *)local_108,pFVar14)
        ;
        function_00 = extraout_RDX_00;
      }
      pFVar14 = (pointer)(local_108._24_8_ + 0x50);
    } while (pFVar14 != (pointer)local_108._32_8_);
    pFVar14 = (pointer)(((string *)local_108._40_8_)->_M_dataplus)._M_p;
    pFVar15 = (pointer)((string *)local_108._40_8_)->_M_string_length;
  }
  if (pFVar14 != pFVar15) {
    do {
      pvVar10 = Loader::Assembly::classes((Assembly *)pFVar14);
      pCVar4 = (pvVar10->
               super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar16 = (pvVar10->
                     super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                     )._M_impl.super__Vector_impl_data._M_start; pCVar16 != pCVar4;
          pCVar16 = pCVar16 + 1) {
        psVar11 = Loader::Class::name_abi_cxx11_(pCVar16);
        this_01 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_a8;
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_a8,psVar11);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        lVar6 = *(long *)((long)iVar12.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                ._M_cur + 0x28);
        local_d8._M_dataplus._M_p = (pointer)(local_108._8_8_ + -local_108._0_8_);
        lVar13 = 0;
        do {
          *(char *)(local_108._0_8_ + lVar13 + lVar6) =
               *(char *)((long)&local_d8._M_dataplus._M_p + lVar13);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 8);
        generateClassBody((AssemblyImageGenerator *)this_01,(BinaryData *)local_108,pCVar16);
      }
      pFVar14 = (pointer)&(pFVar14->mParameters).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    } while (pFVar14 != pFVar15);
  }
  std::ostream::write((char *)local_b0,local_108._0_8_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_a8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_);
  }
  return;
}

Assistant:

void AssemblyImageGenerator::generateImage(std::vector<Loader::Assembly>& assemblies, std::ostream& stream) {
		BinaryData data;

		//Compute the number of functions & classes
		std::size_t numFuncs = 0;
		std::size_t numClasses = 0;
		for (auto& assembly : assemblies) {
			numFuncs += assembly.functions().size();
			numClasses += assembly.classes().size();
		}

		//Header
		addData(data, numFuncs);
		addData(data, numClasses);

		//Functions definitions
		std::unordered_map<std::string, std::size_t> funcBodyOffsets;

		for (auto& assembly : assemblies) {
			for (auto& func : assembly.functions()) {
				generateFunctionDefinition(data, func);
				funcBodyOffsets.insert({ Loader::getSignature(func), data.size() });
				addData<std::size_t>(data, 0);
			}
		}

		//Class definitions
		std::unordered_map<std::string, std::size_t> classBodyOffsets;

		for (auto& assembly : assemblies) {
			for (auto& classDef : assembly.classes()) {
				generateClassDefinition(data, classDef);
				classBodyOffsets.insert({ classDef.name(), data.size() });
				addData<std::size_t>(data, 0);
			}
		}

		//Functions bodies
		for (auto& assembly : assemblies) {
			for (auto& func : assembly.functions()) {
				//Patch the offset
				setData<std::size_t>(data, funcBodyOffsets.at(Loader::getSignature(func)), data.size());
				generateFunctionBody(data, func);
			}
		}

		//Class bodies
		for (auto& assembly : assemblies) {
			for (auto& classDef : assembly.classes()) {
				//Patch the offset
				setData<std::size_t>(data, classBodyOffsets.at(classDef.name()), data.size());
				generateClassBody(data, classDef);
			}
		}

		//Write to the stream
		stream.write(data.data(), data.size());
	}